

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

int stbi__create_png_image_raw
              (stbi__png *a,stbi_uc *raw,stbi__uint32 raw_len,int out_n,stbi__uint32 x,
              stbi__uint32 y,int depth,int color)

{
  ushort *puVar1;
  int iVar2;
  stbi__context *psVar3;
  byte bVar4;
  byte bVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  stbi_uc *psVar12;
  long lVar13;
  long lVar14;
  uint uVar15;
  stbi_uc *psVar16;
  ulong uVar17;
  byte *pbVar18;
  uint uVar19;
  int iVar20;
  uint uVar21;
  int iVar22;
  long lVar23;
  long lVar24;
  uint uVar25;
  ulong uVar27;
  byte bVar28;
  stbi_uc *psVar29;
  byte *pbVar30;
  byte bVar31;
  long lVar32;
  uint uVar33;
  stbi_uc *psVar34;
  uint uVar35;
  long lVar36;
  bool bVar37;
  ulong local_60;
  ulong uVar26;
  
  bVar37 = depth == 0x10;
  uVar6 = x * out_n;
  uVar7 = uVar6 << bVar37;
  psVar3 = a->s;
  iVar2 = psVar3->img_n;
  uVar8 = iVar2 << bVar37;
  if (iVar2 + 1 != out_n && iVar2 != out_n) {
    __assert_fail("out_n == s->img_n || out_n == s->img_n+1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sienkiewiczkm[P]ltc_fitter/dependencies/stb/stb_image.h"
                  ,0x10c6,
                  "int stbi__create_png_image_raw(stbi__png *, stbi_uc *, stbi__uint32, int, stbi__uint32, stbi__uint32, int, int)"
                 );
  }
  psVar12 = (stbi_uc *)stbi__malloc_mad3(x,y,out_n << bVar37,0);
  a->out = psVar12;
  if (psVar12 == (stbi_uc *)0x0) {
    stbi__g_failure_reason = "outofmem";
  }
  else {
    iVar9 = iVar2 * x;
    uVar25 = iVar9 * depth + 7U >> 3;
    uVar26 = (ulong)uVar25;
    uVar10 = (uVar25 + 1) * y;
    if ((psVar3->img_x == x) && (psVar3->img_y == y)) {
      if (uVar10 == raw_len) {
LAB_0019bee8:
        lVar13 = (long)iVar2;
        if (y != 0) {
          lVar32 = -(ulong)uVar7;
          lVar36 = (long)(out_n << bVar37);
          iVar11 = x - 1;
          lVar14 = -lVar36;
          uVar10 = 0;
          uVar17 = 0;
          local_60 = (ulong)x;
          do {
            pbVar18 = raw + 1;
            bVar4 = *raw;
            if ((ulong)bVar4 < 5) {
              psVar12 = a->out + uVar7 * (int)uVar17;
              if (depth < 8) {
                if (x < uVar25) {
                  __assert_fail("img_width_bytes <= x",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/sienkiewiczkm[P]ltc_fitter/dependencies/stb/stb_image.h"
                                ,0x10db,
                                "int stbi__create_png_image_raw(stbi__png *, stbi_uc *, stbi__uint32, int, stbi__uint32, stbi__uint32, int, int)"
                               );
                }
                psVar12 = psVar12 + (uVar6 - uVar25);
                uVar8 = 1;
                local_60 = uVar26;
              }
              bVar5 = bVar4;
              if (uVar17 == 0) {
                bVar5 = ""[bVar4];
              }
              if (0 < (int)uVar8) {
                uVar27 = 0;
                do {
                  switch(bVar5) {
                  case 0:
                  case 1:
                  case 5:
                  case 6:
                    bVar31 = pbVar18[uVar27];
                    goto LAB_0019c05c;
                  case 2:
                  case 4:
                    bVar31 = psVar12[uVar27 + lVar32];
                    break;
                  case 3:
                    bVar31 = psVar12[uVar27 + lVar32] >> 1;
                    break;
                  default:
                    goto switchD_0019c042_default;
                  }
                  bVar31 = bVar31 + pbVar18[uVar27];
LAB_0019c05c:
                  psVar12[uVar27] = bVar31;
switchD_0019c042_default:
                  uVar27 = uVar27 + 1;
                } while (uVar8 != uVar27);
              }
              if (depth == 8) {
                lVar24 = (long)out_n;
                lVar23 = lVar13;
                if (iVar2 != out_n) {
                  psVar12[lVar13] = 0xff;
                }
LAB_0019c0be:
                pbVar18 = pbVar18 + lVar23;
              }
              else {
                if (depth == 0x10) {
                  lVar23 = (long)(int)uVar8;
                  lVar24 = lVar36;
                  if (iVar2 != out_n) {
                    (psVar12 + lVar23)[0] = 0xff;
                    (psVar12 + lVar23)[1] = 0xff;
                  }
                  goto LAB_0019c0be;
                }
                pbVar18 = raw + 2;
                lVar24 = 1;
              }
              psVar34 = psVar12 + lVar24;
              if (depth < 8 || iVar2 == out_n) {
                uVar15 = ((int)local_60 + -1) * uVar8;
                switch(bVar5) {
                case 0:
                  memcpy(psVar34,pbVar18,(long)(int)uVar15);
                  break;
                case 1:
                  if (0 < (int)uVar15) {
                    uVar27 = 0;
                    do {
                      psVar34[uVar27] = psVar12[uVar27 + (lVar24 - (int)uVar8)] + pbVar18[uVar27];
                      uVar27 = uVar27 + 1;
                    } while (uVar15 != uVar27);
                  }
                  break;
                case 2:
                  if (0 < (int)uVar15) {
                    uVar27 = 0;
                    do {
                      psVar34[uVar27] = psVar34[uVar27 + lVar32] + pbVar18[uVar27];
                      uVar27 = uVar27 + 1;
                    } while (uVar15 != uVar27);
                  }
                  break;
                case 3:
                  if (0 < (int)uVar15) {
                    uVar27 = 0;
                    do {
                      psVar34[uVar27] =
                           (char)((uint)psVar12[uVar27 + (lVar24 - (int)uVar8)] +
                                  (uint)psVar34[uVar27 + lVar32] >> 1) + pbVar18[uVar27];
                      uVar27 = uVar27 + 1;
                    } while (uVar15 != uVar27);
                  }
                  break;
                case 4:
                  if (0 < (int)uVar15) {
                    pbVar30 = psVar12 + (lVar24 - (int)uVar8);
                    uVar27 = 0;
                    do {
                      bVar5 = *pbVar30;
                      bVar31 = psVar34[lVar32];
                      bVar28 = pbVar30[lVar32];
                      iVar20 = ((uint)bVar31 + (uint)bVar5) - (uint)bVar28;
                      uVar33 = iVar20 - (uint)bVar5;
                      uVar35 = -uVar33;
                      if (0 < (int)uVar33) {
                        uVar35 = uVar33;
                      }
                      uVar19 = iVar20 - (uint)bVar31;
                      uVar33 = -uVar19;
                      if (0 < (int)uVar19) {
                        uVar33 = uVar19;
                      }
                      uVar21 = iVar20 - (uint)bVar28;
                      uVar19 = -uVar21;
                      if (0 < (int)uVar21) {
                        uVar19 = uVar21;
                      }
                      if (uVar33 <= uVar19) {
                        bVar28 = bVar31;
                      }
                      if (uVar19 < uVar35) {
                        bVar5 = bVar28;
                      }
                      if (uVar33 < uVar35) {
                        bVar5 = bVar28;
                      }
                      *psVar34 = bVar5 + pbVar18[uVar27];
                      uVar27 = uVar27 + 1;
                      pbVar30 = pbVar30 + 1;
                      psVar34 = psVar34 + 1;
                    } while (uVar15 != uVar27);
                  }
                  break;
                case 5:
                  if (0 < (int)uVar15) {
                    uVar27 = 0;
                    do {
                      psVar34[uVar27] =
                           (psVar12[uVar27 + (lVar24 - (int)uVar8)] >> 1) + pbVar18[uVar27];
                      uVar27 = uVar27 + 1;
                    } while (uVar15 != uVar27);
                  }
                  break;
                case 6:
                  if (0 < (int)uVar15) {
                    uVar27 = 0;
                    do {
                      psVar34[uVar27] = psVar12[uVar27 + (lVar24 - (int)uVar8)] + pbVar18[uVar27];
                      uVar27 = uVar27 + 1;
                    } while (uVar15 != uVar27);
                  }
                }
                pbVar18 = pbVar18 + (int)uVar15;
              }
              else {
                if (iVar2 + 1 != out_n) {
                  __assert_fail("img_n+1 == out_n",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/sienkiewiczkm[P]ltc_fitter/dependencies/stb/stb_image.h"
                                ,0x1119,
                                "int stbi__create_png_image_raw(stbi__png *, stbi_uc *, stbi__uint32, int, stbi__uint32, stbi__uint32, int, int)"
                               );
                }
                switch(bVar5) {
                case 0:
                  if (iVar11 != 0) {
                    iVar20 = iVar11;
                    do {
                      if (0 < (int)uVar8) {
                        uVar27 = 0;
                        do {
                          psVar34[uVar27] = pbVar18[uVar27];
                          uVar27 = uVar27 + 1;
                        } while (uVar8 != uVar27);
                      }
                      psVar34[(int)uVar8] = 0xff;
                      pbVar18 = pbVar18 + (int)uVar8;
                      psVar34 = psVar34 + lVar36;
                      iVar20 = iVar20 + -1;
                    } while (iVar20 != 0);
                  }
                  break;
                case 1:
                  if (iVar11 != 0) {
                    psVar12 = psVar12 + lVar24 + lVar14;
                    iVar20 = iVar11;
                    do {
                      if (0 < (int)uVar8) {
                        uVar27 = 0;
                        do {
                          psVar34[uVar27] = psVar12[uVar27] + pbVar18[uVar27];
                          uVar27 = uVar27 + 1;
                        } while (uVar8 != uVar27);
                      }
                      psVar34[(int)uVar8] = 0xff;
                      pbVar18 = pbVar18 + (int)uVar8;
                      psVar34 = psVar34 + lVar36;
                      psVar12 = psVar12 + lVar36;
                      iVar20 = iVar20 + -1;
                    } while (iVar20 != 0);
                  }
                  break;
                case 2:
                  if (iVar11 != 0) {
                    iVar20 = iVar11;
                    do {
                      if (0 < (int)uVar8) {
                        uVar27 = 0;
                        do {
                          psVar34[uVar27] = psVar34[uVar27 + lVar32] + pbVar18[uVar27];
                          uVar27 = uVar27 + 1;
                        } while (uVar8 != uVar27);
                      }
                      psVar34[(int)uVar8] = 0xff;
                      pbVar18 = pbVar18 + (int)uVar8;
                      psVar34 = psVar34 + lVar36;
                      iVar20 = iVar20 + -1;
                    } while (iVar20 != 0);
                  }
                  break;
                case 3:
                  if (iVar11 != 0) {
                    iVar20 = iVar11;
                    do {
                      if (0 < (int)uVar8) {
                        uVar27 = 0;
                        psVar12 = psVar34;
                        do {
                          *psVar12 = (char)((uint)psVar12[lVar14] + (uint)psVar12[lVar32] >> 1) +
                                     pbVar18[uVar27];
                          uVar27 = uVar27 + 1;
                          psVar12 = psVar12 + 1;
                        } while (uVar8 != uVar27);
                      }
                      psVar34[(int)uVar8] = 0xff;
                      pbVar18 = pbVar18 + (int)uVar8;
                      psVar34 = psVar34 + lVar36;
                      iVar20 = iVar20 + -1;
                    } while (iVar20 != 0);
                  }
                  break;
                case 4:
                  if (iVar11 != 0) {
                    psVar16 = psVar12 + lVar24 + lVar32;
                    psVar29 = psVar12 + lVar24 + lVar14;
                    psVar12 = psVar12 + lVar24 + (lVar14 - (ulong)uVar7);
                    iVar20 = iVar11;
                    do {
                      if (0 < (int)uVar8) {
                        uVar27 = 0;
                        do {
                          bVar5 = psVar29[uVar27];
                          bVar31 = psVar16[uVar27];
                          bVar28 = psVar12[uVar27];
                          iVar22 = ((uint)bVar31 + (uint)bVar5) - (uint)bVar28;
                          uVar35 = iVar22 - (uint)bVar5;
                          uVar15 = -uVar35;
                          if (0 < (int)uVar35) {
                            uVar15 = uVar35;
                          }
                          uVar33 = iVar22 - (uint)bVar31;
                          uVar35 = -uVar33;
                          if (0 < (int)uVar33) {
                            uVar35 = uVar33;
                          }
                          uVar19 = iVar22 - (uint)bVar28;
                          uVar33 = -uVar19;
                          if (0 < (int)uVar19) {
                            uVar33 = uVar19;
                          }
                          if (uVar35 <= uVar33) {
                            bVar28 = bVar31;
                          }
                          if (uVar33 < uVar15) {
                            bVar5 = bVar28;
                          }
                          if (uVar35 < uVar15) {
                            bVar5 = bVar28;
                          }
                          psVar34[uVar27] = bVar5 + pbVar18[uVar27];
                          uVar27 = uVar27 + 1;
                        } while (uVar8 != uVar27);
                      }
                      psVar34[(int)uVar8] = 0xff;
                      pbVar18 = pbVar18 + (int)uVar8;
                      psVar34 = psVar34 + lVar36;
                      psVar16 = psVar16 + lVar36;
                      psVar29 = psVar29 + lVar36;
                      psVar12 = psVar12 + lVar36;
                      iVar20 = iVar20 + -1;
                    } while (iVar20 != 0);
                  }
                  break;
                case 5:
                  if (iVar11 != 0) {
                    psVar12 = psVar12 + lVar24 + lVar14;
                    iVar20 = iVar11;
                    do {
                      if (0 < (int)uVar8) {
                        uVar27 = 0;
                        do {
                          psVar34[uVar27] = (psVar12[uVar27] >> 1) + pbVar18[uVar27];
                          uVar27 = uVar27 + 1;
                        } while (uVar8 != uVar27);
                      }
                      psVar34[(int)uVar8] = 0xff;
                      pbVar18 = pbVar18 + (int)uVar8;
                      psVar34 = psVar34 + lVar36;
                      psVar12 = psVar12 + lVar36;
                      iVar20 = iVar20 + -1;
                    } while (iVar20 != 0);
                  }
                  break;
                case 6:
                  if (iVar11 != 0) {
                    psVar12 = psVar12 + lVar24 + lVar14;
                    iVar20 = iVar11;
                    do {
                      if (0 < (int)uVar8) {
                        uVar27 = 0;
                        do {
                          psVar34[uVar27] = psVar12[uVar27] + pbVar18[uVar27];
                          uVar27 = uVar27 + 1;
                        } while (uVar8 != uVar27);
                      }
                      psVar34[(int)uVar8] = 0xff;
                      pbVar18 = pbVar18 + (int)uVar8;
                      psVar34 = psVar34 + lVar36;
                      psVar12 = psVar12 + lVar36;
                      iVar20 = iVar20 + -1;
                    } while (iVar20 != 0);
                  }
                }
                if (x != 0 && depth == 0x10) {
                  psVar12 = a->out + (long)(int)uVar8 + (ulong)uVar10 + 1;
                  uVar27 = (ulong)x;
                  do {
                    *psVar12 = 0xff;
                    psVar12 = psVar12 + lVar36;
                    uVar15 = (int)uVar27 - 1;
                    uVar27 = (ulong)uVar15;
                  } while (uVar15 != 0);
                }
              }
            }
            else {
              stbi__g_failure_reason = "invalid filter";
            }
            if (4 < bVar4) {
              return 0;
            }
            uVar17 = uVar17 + 1;
            uVar10 = uVar10 + uVar7;
            raw = pbVar18;
          } while (uVar17 != y);
        }
        if (7 < depth) {
          if (depth != 0x10) {
            return 1;
          }
          if (uVar6 * y != 0) {
            psVar12 = a->out;
            lVar13 = 0;
            do {
              puVar1 = (ushort *)(psVar12 + lVar13 * 2);
              *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
              lVar13 = lVar13 + 1;
            } while (uVar6 * y != (int)lVar13);
            return 1;
          }
          return 1;
        }
        if (y == 0) {
          return 1;
        }
        uVar8 = x - 1;
        lVar13 = uVar6 - uVar26;
        lVar14 = (ulong)uVar8 + 1;
        uVar10 = 0;
        uVar17 = 0;
        do {
          bVar4 = 1;
          if (color == 0) {
            bVar4 = ""[depth];
          }
          psVar12 = a->out;
          pbVar30 = psVar12 + uVar7 * (int)uVar17;
          pbVar18 = pbVar30 + (uVar6 - uVar26);
          uVar27 = (ulong)uVar10;
          if (depth == 4) {
            iVar11 = iVar9;
            if (1 < iVar9) {
              psVar34 = psVar12 + lVar13;
              iVar20 = iVar9;
              do {
                psVar12[uVar27] = (psVar34[uVar27] >> 4) * bVar4;
                psVar12[uVar27 + 1] = (psVar34[uVar27] & 0xf) * bVar4;
                iVar11 = iVar20 + -2;
                psVar34 = psVar34 + 1;
                psVar12 = psVar12 + 2;
                bVar37 = 3 < iVar20;
                iVar20 = iVar11;
              } while (bVar37);
              pbVar18 = psVar34 + uVar27;
              pbVar30 = psVar12 + uVar27;
            }
            if (iVar11 == 1) {
              bVar5 = *pbVar18 >> 4;
LAB_0019c91f:
              bVar4 = bVar5 * bVar4;
LAB_0019c922:
              *pbVar30 = bVar4;
            }
          }
          else if (depth == 2) {
            iVar11 = iVar9;
            if (3 < iVar9) {
              psVar34 = psVar12 + lVar13;
              iVar20 = iVar9;
              do {
                psVar12[uVar27] = (psVar34[uVar27] >> 6) * bVar4;
                psVar12[uVar27 + 1] = (psVar34[uVar27] >> 4 & 3) * bVar4;
                psVar12[uVar27 + 2] = (psVar34[uVar27] >> 2 & 3) * bVar4;
                psVar12[uVar27 + 3] = (psVar34[uVar27] & 3) * bVar4;
                iVar11 = iVar20 + -4;
                psVar34 = psVar34 + 1;
                psVar12 = psVar12 + 4;
                bVar37 = 7 < iVar20;
                iVar20 = iVar11;
              } while (bVar37);
              pbVar18 = psVar34 + uVar27;
              pbVar30 = psVar12 + uVar27;
            }
            if (0 < iVar11) {
              *pbVar30 = (*pbVar18 >> 6) * bVar4;
              pbVar30 = pbVar30 + 1;
            }
            if (1 < iVar11) {
              *pbVar30 = (*pbVar18 >> 4 & 3) * bVar4;
              pbVar30 = pbVar30 + 1;
            }
            if (iVar11 == 3) {
              bVar5 = *pbVar18 >> 2 & 3;
              goto LAB_0019c91f;
            }
          }
          else if (depth == 1) {
            iVar11 = iVar9;
            if (7 < iVar9) {
              psVar34 = psVar12 + lVar13;
              iVar20 = iVar9;
              do {
                psVar12[uVar27] = (char)psVar34[uVar27] >> 7 & bVar4;
                psVar12[uVar27 + 1] = (char)(psVar34[uVar27] * '\x02') >> 7 & bVar4;
                psVar12[uVar27 + 2] = (char)(psVar34[uVar27] << 2) >> 7 & bVar4;
                psVar12[uVar27 + 3] = (char)(psVar34[uVar27] << 3) >> 7 & bVar4;
                psVar12[uVar27 + 4] = (char)(psVar34[uVar27] << 4) >> 7 & bVar4;
                psVar12[uVar27 + 5] = (char)(psVar34[uVar27] << 5) >> 7 & bVar4;
                psVar12[uVar27 + 6] = (char)(psVar34[uVar27] << 6) >> 7 & bVar4;
                bVar5 = bVar4;
                if ((psVar34[uVar27] & 1) == 0) {
                  bVar5 = 0;
                }
                psVar12[uVar27 + 7] = bVar5;
                iVar11 = iVar20 + -8;
                psVar34 = psVar34 + 1;
                psVar12 = psVar12 + 8;
                bVar37 = 0xf < iVar20;
                iVar20 = iVar11;
              } while (bVar37);
              pbVar18 = psVar34 + uVar27;
              pbVar30 = psVar12 + uVar27;
            }
            if (0 < iVar11) {
              *pbVar30 = (char)*pbVar18 >> 7 & bVar4;
              pbVar30 = pbVar30 + 1;
            }
            if (1 < iVar11) {
              *pbVar30 = (char)(*pbVar18 * '\x02') >> 7 & bVar4;
              pbVar30 = pbVar30 + 1;
            }
            if (2 < iVar11) {
              *pbVar30 = (char)(*pbVar18 << 2) >> 7 & bVar4;
              pbVar30 = pbVar30 + 1;
            }
            if (3 < iVar11) {
              *pbVar30 = (char)(*pbVar18 << 3) >> 7 & bVar4;
              pbVar30 = pbVar30 + 1;
            }
            if (4 < iVar11) {
              *pbVar30 = (char)(*pbVar18 << 4) >> 7 & bVar4;
              pbVar30 = pbVar30 + 1;
            }
            if (5 < iVar11) {
              *pbVar30 = (char)(*pbVar18 << 5) >> 7 & bVar4;
              pbVar30 = pbVar30 + 1;
            }
            if (iVar11 == 7) {
              bVar4 = (char)(*pbVar18 << 6) >> 7 & bVar4;
              goto LAB_0019c922;
            }
          }
          if (iVar2 != out_n) {
            psVar12 = a->out;
            if (iVar2 == 1) {
              lVar32 = lVar14;
              if (-1 < (int)uVar8) {
                do {
                  psVar12[lVar32 * 2 + (uVar27 - 1)] = 0xff;
                  psVar12[lVar32 * 2 + (uVar27 - 2)] = psVar12[lVar32 + (uVar27 - 1)];
                  lVar36 = lVar32 + -1;
                  bVar37 = 0 < lVar32;
                  lVar32 = lVar36;
                } while (lVar36 != 0 && bVar37);
              }
            }
            else {
              if (iVar2 != 3) {
                __assert_fail("img_n == 3",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sienkiewiczkm[P]ltc_fitter/dependencies/stb/stb_image.h"
                              ,0x1172,
                              "int stbi__create_png_image_raw(stbi__png *, stbi_uc *, stbi__uint32, int, stbi__uint32, stbi__uint32, int, int)"
                             );
              }
              if (-1 < (int)uVar8) {
                psVar34 = psVar12 + (ulong)uVar8 * 3 + 2 + uVar27;
                lVar32 = lVar14;
                do {
                  psVar12[lVar32 * 4 + (uVar27 - 1)] = 0xff;
                  psVar12[lVar32 * 4 + (uVar27 - 2)] = *psVar34;
                  psVar12[lVar32 * 4 + (uVar27 - 3)] = psVar34[-1];
                  psVar12[lVar32 * 4 + (uVar27 - 4)] = psVar34[-2];
                  psVar34 = psVar34 + -3;
                  lVar36 = lVar32 + -1;
                  bVar37 = 0 < lVar32;
                  lVar32 = lVar36;
                } while (lVar36 != 0 && bVar37);
              }
            }
          }
          uVar17 = uVar17 + 1;
          uVar10 = uVar10 + uVar7;
          if (uVar17 == y) {
            return 1;
          }
        } while( true );
      }
    }
    else if (uVar10 <= raw_len) goto LAB_0019bee8;
    stbi__g_failure_reason = "not enough pixels";
  }
  return 0;
}

Assistant:

static int stbi__create_png_image_raw(stbi__png *a, stbi_uc *raw, stbi__uint32 raw_len, int out_n, stbi__uint32 x, stbi__uint32 y, int depth, int color)
{
   int bytes = (depth == 16? 2 : 1);
   stbi__context *s = a->s;
   stbi__uint32 i,j,stride = x*out_n*bytes;
   stbi__uint32 img_len, img_width_bytes;
   int k;
   int img_n = s->img_n; // copy it into a local for later

   int output_bytes = out_n*bytes;
   int filter_bytes = img_n*bytes;
   int width = x;

   STBI_ASSERT(out_n == s->img_n || out_n == s->img_n+1);
   a->out = (stbi_uc *) stbi__malloc_mad3(x, y, output_bytes, 0); // extra bytes to write off the end into
   if (!a->out) return stbi__err("outofmem", "Out of memory");

   img_width_bytes = (((img_n * x * depth) + 7) >> 3);
   img_len = (img_width_bytes + 1) * y;
   if (s->img_x == x && s->img_y == y) {
      if (raw_len != img_len) return stbi__err("not enough pixels","Corrupt PNG");
   } else { // interlaced:
      if (raw_len < img_len) return stbi__err("not enough pixels","Corrupt PNG");
   }

   for (j=0; j < y; ++j) {
      stbi_uc *cur = a->out + stride*j;
      stbi_uc *prior;
      int filter = *raw++;

      if (filter > 4)
         return stbi__err("invalid filter","Corrupt PNG");

      if (depth < 8) {
         STBI_ASSERT(img_width_bytes <= x);
         cur += x*out_n - img_width_bytes; // store output to the rightmost img_len bytes, so we can decode in place
         filter_bytes = 1;
         width = img_width_bytes;
      }
      prior = cur - stride; // bugfix: need to compute this after 'cur +=' computation above

      // if first row, use special filter that doesn't sample previous row
      if (j == 0) filter = first_row_filter[filter];

      // handle first byte explicitly
      for (k=0; k < filter_bytes; ++k) {
         switch (filter) {
            case STBI__F_none       : cur[k] = raw[k]; break;
            case STBI__F_sub        : cur[k] = raw[k]; break;
            case STBI__F_up         : cur[k] = STBI__BYTECAST(raw[k] + prior[k]); break;
            case STBI__F_avg        : cur[k] = STBI__BYTECAST(raw[k] + (prior[k]>>1)); break;
            case STBI__F_paeth      : cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(0,prior[k],0)); break;
            case STBI__F_avg_first  : cur[k] = raw[k]; break;
            case STBI__F_paeth_first: cur[k] = raw[k]; break;
         }
      }

      if (depth == 8) {
         if (img_n != out_n)
            cur[img_n] = 255; // first pixel
         raw += img_n;
         cur += out_n;
         prior += out_n;
      } else if (depth == 16) {
         if (img_n != out_n) {
            cur[filter_bytes]   = 255; // first pixel top byte
            cur[filter_bytes+1] = 255; // first pixel bottom byte
         }
         raw += filter_bytes;
         cur += output_bytes;
         prior += output_bytes;
      } else {
         raw += 1;
         cur += 1;
         prior += 1;
      }

      // this is a little gross, so that we don't switch per-pixel or per-component
      if (depth < 8 || img_n == out_n) {
         int nk = (width - 1)*filter_bytes;
         #define STBI__CASE(f) \
             case f:     \
                for (k=0; k < nk; ++k)
         switch (filter) {
            // "none" filter turns into a memcpy here; make that explicit.
            case STBI__F_none:         memcpy(cur, raw, nk); break;
            STBI__CASE(STBI__F_sub)          { cur[k] = STBI__BYTECAST(raw[k] + cur[k-filter_bytes]); } break;
            STBI__CASE(STBI__F_up)           { cur[k] = STBI__BYTECAST(raw[k] + prior[k]); } break;
            STBI__CASE(STBI__F_avg)          { cur[k] = STBI__BYTECAST(raw[k] + ((prior[k] + cur[k-filter_bytes])>>1)); } break;
            STBI__CASE(STBI__F_paeth)        { cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k-filter_bytes],prior[k],prior[k-filter_bytes])); } break;
            STBI__CASE(STBI__F_avg_first)    { cur[k] = STBI__BYTECAST(raw[k] + (cur[k-filter_bytes] >> 1)); } break;
            STBI__CASE(STBI__F_paeth_first)  { cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k-filter_bytes],0,0)); } break;
         }
         #undef STBI__CASE
         raw += nk;
      } else {
         STBI_ASSERT(img_n+1 == out_n);
         #define STBI__CASE(f) \
             case f:     \
                for (i=x-1; i >= 1; --i, cur[filter_bytes]=255,raw+=filter_bytes,cur+=output_bytes,prior+=output_bytes) \
                   for (k=0; k < filter_bytes; ++k)
         switch (filter) {
            STBI__CASE(STBI__F_none)         { cur[k] = raw[k]; } break;
            STBI__CASE(STBI__F_sub)          { cur[k] = STBI__BYTECAST(raw[k] + cur[k- output_bytes]); } break;
            STBI__CASE(STBI__F_up)           { cur[k] = STBI__BYTECAST(raw[k] + prior[k]); } break;
            STBI__CASE(STBI__F_avg)          { cur[k] = STBI__BYTECAST(raw[k] + ((prior[k] + cur[k- output_bytes])>>1)); } break;
            STBI__CASE(STBI__F_paeth)        { cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k- output_bytes],prior[k],prior[k- output_bytes])); } break;
            STBI__CASE(STBI__F_avg_first)    { cur[k] = STBI__BYTECAST(raw[k] + (cur[k- output_bytes] >> 1)); } break;
            STBI__CASE(STBI__F_paeth_first)  { cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k- output_bytes],0,0)); } break;
         }
         #undef STBI__CASE

         // the loop above sets the high byte of the pixels' alpha, but for
         // 16 bit png files we also need the low byte set. we'll do that here.
         if (depth == 16) {
            cur = a->out + stride*j; // start at the beginning of the row again
            for (i=0; i < x; ++i,cur+=output_bytes) {
               cur[filter_bytes+1] = 255;
            }
         }
      }